

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<char8_t,std::allocator<char8_t>>,void>
               (vector<char8_t,_std::allocator<char8_t>_> *container,ostream *os)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  long lVar4;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  pbVar2 = (byte *)(container->super__Vector_base<char8_t,_std::allocator<char8_t>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  pbVar3 = (byte *)(container->super__Vector_base<char8_t,_std::allocator<char8_t>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  if (pbVar2 != pbVar3) {
    lVar4 = 0;
    do {
      if ((lVar4 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1), lVar4 == 0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        goto LAB_00327ee7;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
      pbVar1 = pbVar2 + lVar4;
      testing::internal::PrintTo((uint)*pbVar1,os);
      lVar4 = lVar4 + 1;
    } while (pbVar1 + 1 != pbVar3);
    if (pbVar3 != pbVar2) {
LAB_00327ee7:
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }